

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

void __thiscall
Clasp::Solver::otfs(Solver *this,Antecedent *lhs,Antecedent *rhs,Literal p,bool final)

{
  pointer pAVar1;
  uint uVar2;
  ClauseHead *c;
  ClauseHead *c_00;
  ClauseHead *pCVar3;
  
  c = clause(lhs);
  c_00 = clause(rhs);
  if ((c == (ClauseHead *)0x0) ||
     (uVar2 = (*(c->super_Constraint)._vptr_Constraint[0x16])
                        (c,this,(ulong)(p.rep_ & 0xfffffffe ^ 2),(ulong)!final), (uVar2 & 1) == 0))
  {
    c = (ClauseHead *)0x0;
  }
  else if ((uVar2 >> 8 & 1) != 0) {
    c = otfsRemove(this,c,(LitVec *)0x0);
  }
  lhs->data_ = (uint64)c;
  if (c_00 == (ClauseHead *)0x0) {
    return;
  }
  uVar2 = (*(c_00->super_Constraint)._vptr_Constraint[0x16])(c_00,this,(ulong)p.rep_,(ulong)!final);
  if ((uVar2 & 1) != 0) {
    if (((uVar2 >> 8 & 1) == 0) ||
       (pCVar3 = otfsRemove(this,c_00,(LitVec *)0x0), pCVar3 != (ClauseHead *)0x0)) {
      if (c != (ClauseHead *)0x0) {
        pCVar3 = c;
        if (((c->info_).super_ConstraintScore.rep & 0x30000000) == 0) {
          pCVar3 = c_00;
          c_00 = c;
        }
        otfsRemove(this,pCVar3,(LitVec *)0x0);
      }
      goto LAB_001646e8;
    }
    pAVar1 = (this->assign_).reason_.super_type.ebo_.buf;
    if ((ClauseHead *)pAVar1[p.rep_ >> 2].data_ == c_00) {
      pAVar1[p.rep_ >> 2].data_ = 0;
    }
  }
  c_00 = (ClauseHead *)0x0;
LAB_001646e8:
  lhs->data_ = (uint64)c_00;
  return;
}

Assistant:

void Solver::otfs(Antecedent& lhs, const Antecedent& rhs, Literal p, bool final) {
	ClauseHead* cLhs = clause(lhs), *cRhs = clause(rhs);
	ClauseHead::BoolPair x;
	if (cLhs) {
		x = cLhs->strengthen(*this, ~p, !final);
		if (!x.first || x.second) {
			cLhs = !x.first ? 0 : otfsRemove(cLhs, 0);
		}
	}
	lhs = cLhs;
	if (cRhs) {
		x = cRhs->strengthen(*this, p, !final);
		if (!x.first || (x.second && otfsRemove(cRhs, 0) == 0)) {
			if (x.first && reason(p) == cRhs) { setReason(p, 0); }
			cRhs = 0;
		}
		if (cLhs && cRhs) {
			// lhs and rhs are now equal - only one of them is needed
			if (!cLhs->learnt()) {
				std::swap(cLhs, cRhs);
			}
			otfsRemove(cLhs, 0);
		}
		lhs = cRhs;
	}
}